

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O3

Vec_Ptr_t * createArenaLO(Aig_Man_t *pAigNew,Vec_Ptr_t *vBarriers)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Aig_Obj_t *pAVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  
  if ((vBarriers == (Vec_Ptr_t *)0x0) || (uVar1 = vBarriers->nSize, (int)uVar1 < 1)) {
    pVVar2 = (Vec_Ptr_t *)0x0;
  }
  else {
    pVVar2 = (Vec_Ptr_t *)malloc(0x10);
    uVar7 = 8;
    if (8 < uVar1) {
      uVar7 = (ulong)uVar1;
    }
    pVVar2->nSize = 0;
    pVVar2->nCap = (int)uVar7;
    ppvVar3 = (void **)malloc(uVar7 * 8);
    pVVar2->pArray = ppvVar3;
    lVar8 = 0;
    do {
      pAVar4 = Aig_ObjCreateCi(pAigNew);
      iVar6 = (int)uVar7;
      if ((int)lVar8 == iVar6) {
        if (iVar6 < 0x10) {
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
          }
          pVVar2->pArray = ppvVar3;
          pVVar2->nCap = 0x10;
          uVar7 = 0x10;
        }
        else {
          uVar7 = (ulong)(uint)(iVar6 * 2);
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(uVar7 * 8);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar2->pArray,uVar7 * 8);
          }
          pVVar2->pArray = ppvVar3;
          pVVar2->nCap = iVar6 * 2;
        }
      }
      else {
        ppvVar3 = pVVar2->pArray;
      }
      uVar5 = (uint)(lVar8 + 1);
      pVVar2->nSize = uVar5;
      ppvVar3[lVar8] = pAVar4;
      lVar8 = lVar8 + 1;
    } while (uVar1 != uVar5);
  }
  return pVVar2;
}

Assistant:

ABC_NAMESPACE_IMPL_START

Vec_Ptr_t * createArenaLO( Aig_Man_t *pAigNew, Vec_Ptr_t *vBarriers )
{
	Vec_Ptr_t *vArenaLO;
	int barrierCount;
	Aig_Obj_t *pObj;
	int i;

	if( vBarriers == NULL )
		return NULL;

	barrierCount = Vec_PtrSize(vBarriers);
	if( barrierCount <= 0 )
		return NULL;

	vArenaLO = Vec_PtrAlloc(barrierCount);	
	for( i=0; i<barrierCount; i++ )
	{
		pObj = Aig_ObjCreateCi( pAigNew );
		Vec_PtrPush( vArenaLO, pObj );
	}

	return vArenaLO;
}